

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint in_ECX;
  undefined4 uVar5;
  size_t *in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  long in_R9;
  char *k;
  uint already_added_id_text;
  size_t i;
  size_t size;
  uchar *converted;
  uint gray_png;
  uint rgb_icc;
  uint gray_icc;
  uint equal;
  uint sbit_max;
  LodePNGColorMode mode16;
  uint b;
  uint g;
  uint r;
  uint allow_convert;
  LodePNGColorStats stats;
  LodePNGColorMode auto_color;
  LodePNGInfo *info_png;
  LodePNGInfo info;
  ucvector outv;
  size_t datasize;
  uchar *data;
  LodePNGInfo *in_stack_fffffffffffff8f8;
  LodePNGInfo *in_stack_fffffffffffff900;
  ucvector *in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff911;
  undefined1 in_stack_fffffffffffff912;
  undefined1 in_stack_fffffffffffff913;
  LodePNGColorType in_stack_fffffffffffff914;
  LodePNGColorType in_stack_fffffffffffff918;
  LodePNGColorType in_stack_fffffffffffff91c;
  uint in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  uint in_stack_fffffffffffff928;
  uint in_stack_fffffffffffff92c;
  LodePNGInfo *in_stack_fffffffffffff930;
  uint in_stack_fffffffffffff938;
  bool bVar6;
  uint in_stack_fffffffffffff93c;
  LodePNGColorStats *in_stack_fffffffffffff940;
  char *pcVar7;
  char **ppcVar8;
  ucvector *in_stack_fffffffffffff948;
  LodePNGColorStats *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  uint in_stack_fffffffffffff95c;
  uint in_stack_fffffffffffff960;
  uint in_stack_fffffffffffff964;
  uint in_stack_fffffffffffff968;
  LodePNGColorType in_stack_fffffffffffff96c;
  uint in_stack_fffffffffffff974;
  ucvector *in_stack_fffffffffffff978;
  LodePNGCompressSettings *in_stack_fffffffffffff990;
  uint local_668;
  uint local_664;
  uint local_660;
  uint local_65c;
  uint in_stack_fffffffffffff9e8;
  uint in_stack_fffffffffffff9ec;
  LodePNGColorMode *in_stack_fffffffffffff9f0;
  LodePNGColorMode *in_stack_fffffffffffff9f8;
  uchar *in_stack_fffffffffffffa00;
  LodePNGColorMode *in_stack_fffffffffffffa08;
  uint in_stack_fffffffffffffa10;
  uint in_stack_fffffffffffffa14;
  uchar *in_stack_fffffffffffffa18;
  LodePNGColorStats *in_stack_fffffffffffffa20;
  LodePNGInfo *in_stack_fffffffffffffa40;
  uint in_stack_fffffffffffffa48;
  uint in_stack_fffffffffffffa4c;
  uchar *in_stack_fffffffffffffa50;
  size_t *in_stack_fffffffffffffa58;
  uchar **in_stack_fffffffffffffa60;
  LodePNGEncoderSettings *in_stack_fffffffffffffa70;
  LodePNGColorMode local_228;
  long local_200;
  undefined1 local_1e8 [64];
  long local_1a8;
  char **local_198;
  char **local_190;
  int local_170;
  int local_15c;
  uint local_140;
  uint local_130;
  uint local_128;
  uint local_104;
  uint local_fc;
  int local_e4;
  uint local_d0;
  uint local_a4;
  long local_80;
  long local_78;
  uchar *local_70;
  ucvector local_50;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  uint local_20;
  uint local_1c;
  size_t *local_10;
  undefined8 *local_8;
  
  local_30 = 0;
  local_38 = 0;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ucvector_init(&local_50,(uchar *)0x0,0);
  local_200 = local_28 + 0xd0;
  lodepng_info_init((LodePNGInfo *)0x3500b5);
  lodepng_color_mode_init(&local_228);
  *local_8 = 0;
  *local_10 = 0;
  *(undefined4 *)(local_28 + 0x278) = 0;
  if (((*(int *)(local_200 + 0x10) == 3) || (*(int *)(local_28 + 0x98) != 0)) &&
     ((*(long *)(local_200 + 0x20) == 0 || (0x100 < *(ulong *)(local_200 + 0x20))))) {
    *(undefined4 *)(local_28 + 0x278) = 0x44;
  }
  else if (*(uint *)(local_28 + 0x50) < 3) {
    if (*(uint *)(local_200 + 8) < 2) {
      uVar2 = checkColorValidity(*(LodePNGColorType *)(local_200 + 0x10),*(uint *)(local_200 + 0x14)
                                );
      *(uint *)(local_28 + 0x278) = uVar2;
      if (*(int *)(local_28 + 0x278) == 0) {
        uVar2 = checkColorValidity(*(LodePNGColorType *)(local_28 + 0xa8),*(uint *)(local_28 + 0xac)
                                  );
        *(uint *)(local_28 + 0x278) = uVar2;
        if (*(int *)(local_28 + 0x278) == 0) {
          lodepng_info_copy((LodePNGInfo *)
                            CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                            (LodePNGInfo *)
                            CONCAT44(in_stack_fffffffffffff914,
                                     CONCAT13(in_stack_fffffffffffff913,
                                              CONCAT12(in_stack_fffffffffffff912,
                                                       CONCAT11(in_stack_fffffffffffff911,
                                                                in_stack_fffffffffffff910)))));
          if (*(int *)(local_28 + 0x80) != 0) {
            local_65c = 1;
            lodepng_color_stats_init((LodePNGColorStats *)&stack0xfffffffffffff9a8);
            if (*(int *)(local_200 + 0xfc) != 0) {
              isGrayICCProfile(*(uchar **)(local_200 + 0x108),*(uint *)(local_200 + 0x110));
            }
            if (*(int *)(local_200 + 0xfc) != 0) {
              isRGBICCProfile(*(uchar **)(local_200 + 0x108),*(uint *)(local_200 + 0x110));
            }
            uVar2 = lodepng_compute_color_stats
                              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                               in_stack_fffffffffffffa14,in_stack_fffffffffffffa10,
                               in_stack_fffffffffffffa08);
            *(uint *)(local_28 + 0x278) = uVar2;
            if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
            if (*(int *)(local_200 + 0x38) != 0) {
              local_660 = 0;
              local_664 = 0;
              local_668 = 0;
              lodepng_color_mode_make
                        ((LodePNGColorType)((ulong)in_stack_fffffffffffff900 >> 0x20),
                         (uint)in_stack_fffffffffffff900);
              in_stack_fffffffffffff900 = (LodePNGInfo *)(local_200 + 0x10);
              in_stack_fffffffffffff8f8 = (LodePNGInfo *)&stack0xfffffffffffff970;
              lodepng_convert_rgb(&local_660,&local_664,&local_668,*(uint *)(local_200 + 0x3c),
                                  *(uint *)(local_200 + 0x40),*(uint *)(local_200 + 0x44),
                                  (LodePNGColorMode *)in_stack_fffffffffffff8f8,
                                  (LodePNGColorMode *)in_stack_fffffffffffff900);
              uVar2 = lodepng_color_stats_add
                                (in_stack_fffffffffffff940,in_stack_fffffffffffff93c,
                                 in_stack_fffffffffffff938,
                                 (uint)((ulong)in_stack_fffffffffffff930 >> 0x20),
                                 (uint)in_stack_fffffffffffff930);
              *(uint *)(local_28 + 0x278) = uVar2;
              if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
            }
            uVar2 = auto_choose_color((LodePNGColorMode *)
                                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                                      (LodePNGColorMode *)
                                      CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                                      in_stack_fffffffffffff950);
            *(uint *)(local_28 + 0x278) = uVar2;
            if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
            if (*(int *)(local_200 + 0x160) != 0) {
              if (*(uint *)(local_200 + 0x168) < *(uint *)(local_200 + 0x164)) {
                in_stack_fffffffffffff92c = *(uint *)(local_200 + 0x164);
              }
              else {
                in_stack_fffffffffffff92c = *(uint *)(local_200 + 0x168);
              }
              if (*(uint *)(local_200 + 0x16c) < in_stack_fffffffffffff92c) {
                if (*(uint *)(local_200 + 0x168) < *(uint *)(local_200 + 0x164)) {
                  in_stack_fffffffffffff924 = *(uint *)(local_200 + 0x164);
                  in_stack_fffffffffffff928 = in_stack_fffffffffffff924;
                }
                else {
                  in_stack_fffffffffffff924 = *(uint *)(local_200 + 0x168);
                  in_stack_fffffffffffff928 = in_stack_fffffffffffff924;
                }
              }
              else {
                in_stack_fffffffffffff924 = *(uint *)(local_200 + 0x16c);
              }
              if (*(uint *)(local_200 + 0x170) < in_stack_fffffffffffff924) {
                if (*(uint *)(local_200 + 0x168) < *(uint *)(local_200 + 0x164)) {
                  in_stack_fffffffffffff920 = *(uint *)(local_200 + 0x164);
                }
                else {
                  in_stack_fffffffffffff920 = *(uint *)(local_200 + 0x168);
                }
                if (*(uint *)(local_200 + 0x16c) < in_stack_fffffffffffff920) {
                  if (*(uint *)(local_200 + 0x168) < *(uint *)(local_200 + 0x164)) {
                    in_stack_fffffffffffff914 = *(LodePNGColorType *)(local_200 + 0x164);
                    in_stack_fffffffffffff918 = in_stack_fffffffffffff914;
                    in_stack_fffffffffffff91c = in_stack_fffffffffffff914;
                  }
                  else {
                    in_stack_fffffffffffff914 = *(LodePNGColorType *)(local_200 + 0x168);
                    in_stack_fffffffffffff918 = in_stack_fffffffffffff914;
                    in_stack_fffffffffffff91c = in_stack_fffffffffffff914;
                  }
                }
                else {
                  in_stack_fffffffffffff914 = *(LodePNGColorType *)(local_200 + 0x16c);
                  in_stack_fffffffffffff918 = in_stack_fffffffffffff914;
                }
              }
              else {
                in_stack_fffffffffffff914 = *(LodePNGColorType *)(local_200 + 0x170);
              }
              if ((((*(int *)(local_200 + 0x168) == 0) ||
                   (in_stack_fffffffffffff913 = false,
                   *(int *)(local_200 + 0x168) == *(int *)(local_200 + 0x164))) &&
                  ((*(int *)(local_200 + 0x16c) == 0 ||
                   (in_stack_fffffffffffff913 = false,
                   *(int *)(local_200 + 0x16c) == *(int *)(local_200 + 0x164))))) &&
                 (in_stack_fffffffffffff912 = true,
                 in_stack_fffffffffffff913 = in_stack_fffffffffffff912,
                 *(int *)(local_200 + 0x170) != 0)) {
                in_stack_fffffffffffff912 =
                     *(int *)(local_200 + 0x170) == *(int *)(local_200 + 0x164);
                in_stack_fffffffffffff913 = in_stack_fffffffffffff912;
              }
              in_stack_fffffffffffff968 = (uint)(byte)in_stack_fffffffffffff913;
              local_65c = 0;
              if ((local_1e8._0_4_ == LCT_PALETTE) && (local_228.colortype == LCT_PALETTE)) {
                local_65c = 1;
              }
              if (((local_1e8._0_4_ == LCT_RGB) && (local_228.colortype == LCT_PALETTE)) &&
                 (in_stack_fffffffffffff914 < 9)) {
                local_65c = 1;
              }
              if (((local_1e8._0_4_ == LCT_RGBA) && (local_228.colortype == LCT_PALETTE)) &&
                 ((*(int *)(local_200 + 0x170) == 8 && (in_stack_fffffffffffff914 < 9)))) {
                local_65c = 1;
              }
              if (((local_1e8._0_4_ == LCT_RGB) || (local_1e8._0_4_ == LCT_RGBA)) &&
                 ((local_1e8._4_4_ == 0x10 &&
                  (((local_228.colortype == local_1e8._0_4_ && (local_228.bitdepth == 8)) &&
                   (in_stack_fffffffffffff914 < 9)))))) {
                local_65c = 1;
              }
              in_stack_fffffffffffff96c = in_stack_fffffffffffff914;
              if (((local_1e8._0_4_ != LCT_PALETTE) && (local_228.colortype != LCT_PALETTE)) &&
                 ((in_stack_fffffffffffff968 != 0 &&
                  (*(uint *)(local_200 + 0x164) == local_228.bitdepth)))) {
                local_65c = 1;
              }
            }
            if (((*(int *)(local_28 + 0x98) != 0) && (local_1e8._0_4_ != LCT_GREY)) &&
               ((local_1e8._0_4_ != LCT_GREY_ALPHA &&
                ((local_228.colortype == LCT_GREY || (local_228.colortype == LCT_GREY_ALPHA)))))) {
              local_65c = 0;
            }
            if ((local_65c != 0) &&
               (lodepng_color_mode_copy
                          ((LodePNGColorMode *)in_stack_fffffffffffff8f8,
                           (LodePNGColorMode *)0x350874), *(int *)(local_200 + 0x38) != 0)) {
              in_stack_fffffffffffff8f8 = (LodePNGInfo *)local_1e8;
              in_stack_fffffffffffff900 = (LodePNGInfo *)(local_200 + 0x10);
              uVar2 = lodepng_convert_rgb((uint *)(local_1e8 + 0x2c),(uint *)(local_1e8 + 0x30),
                                          (uint *)(local_1e8 + 0x34),*(uint *)(local_200 + 0x3c),
                                          *(uint *)(local_200 + 0x40),*(uint *)(local_200 + 0x44),
                                          (LodePNGColorMode *)in_stack_fffffffffffff8f8,
                                          (LodePNGColorMode *)in_stack_fffffffffffff900);
              if (uVar2 != 0) {
                *(undefined4 *)(local_28 + 0x278) = 0x68;
                goto LAB_003515fc;
              }
            }
          }
          if (*(int *)(local_200 + 0xfc) != 0) {
            in_stack_fffffffffffff964 =
                 isGrayICCProfile(*(uchar **)(local_200 + 0x108),*(uint *)(local_200 + 0x110));
            in_stack_fffffffffffff960 =
                 isRGBICCProfile(*(uchar **)(local_200 + 0x108),*(uint *)(local_200 + 0x110));
            in_stack_fffffffffffff911 =
                 local_1e8._0_4_ == LCT_GREY || local_1e8._0_4_ == LCT_GREY_ALPHA;
            in_stack_fffffffffffff95c = (uint)(byte)in_stack_fffffffffffff911;
            if ((in_stack_fffffffffffff964 == 0) && (in_stack_fffffffffffff960 == 0)) {
              *(undefined4 *)(local_28 + 0x278) = 100;
              goto LAB_003515fc;
            }
            if (in_stack_fffffffffffff964 != in_stack_fffffffffffff95c) {
              uVar5 = 0x65;
              if (*(int *)(local_28 + 0x80) != 0) {
                uVar5 = 0x66;
              }
              *(undefined4 *)(local_28 + 0x278) = uVar5;
              goto LAB_003515fc;
            }
          }
          iVar3 = lodepng_color_mode_equal
                            ((LodePNGColorMode *)(local_28 + 0xa8),(LodePNGColorMode *)local_1e8);
          if (iVar3 == 0) {
            in_stack_fffffffffffff908 = (ucvector *)((ulong)local_1c * (ulong)local_20);
            uVar2 = lodepng_get_bpp((LodePNGColorMode *)0x350a55);
            in_stack_fffffffffffff948 =
                 (ucvector *)((long)in_stack_fffffffffffff908 * (ulong)uVar2 + 7 >> 3);
            in_stack_fffffffffffff950 = (LodePNGColorStats *)lodepng_malloc(0x350a79);
            if ((in_stack_fffffffffffff950 == (LodePNGColorStats *)0x0) &&
               (in_stack_fffffffffffff948 != (ucvector *)0x0)) {
              *(undefined4 *)(local_28 + 0x278) = 0x53;
            }
            if (*(int *)(local_28 + 0x278) == 0) {
              uVar2 = lodepng_convert((uchar *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
                                      in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
                                      in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
              *(uint *)(local_28 + 0x278) = uVar2;
            }
            if (*(int *)(local_28 + 0x278) == 0) {
              in_stack_fffffffffffff8f8 = (LodePNGInfo *)(local_28 + 0x50);
              uVar2 = preProcessScanlines(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                                          in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                                          in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                                          in_stack_fffffffffffffa70);
              *(uint *)(local_28 + 0x278) = uVar2;
            }
            lodepng_free((void *)0x350b6a);
            iVar3 = *(int *)(local_28 + 0x278);
          }
          else {
            in_stack_fffffffffffff8f8 = (LodePNGInfo *)(local_28 + 0x50);
            uVar2 = preProcessScanlines(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                                        in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                                        in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                                        in_stack_fffffffffffffa70);
            *(uint *)(local_28 + 0x278) = uVar2;
            iVar3 = *(int *)(local_28 + 0x278);
          }
          if (iVar3 == 0) {
            uVar2 = writeSignature(in_stack_fffffffffffff908);
            *(uint *)(local_28 + 0x278) = uVar2;
            if (*(int *)(local_28 + 0x278) == 0) {
              uVar2 = addChunk_IHDR((ucvector *)
                                    CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                    in_stack_fffffffffffff924,in_stack_fffffffffffff920,
                                    in_stack_fffffffffffff91c,in_stack_fffffffffffff918,
                                    in_stack_fffffffffffff914);
              *(uint *)(local_28 + 0x278) = uVar2;
              if (*(int *)(local_28 + 0x278) == 0) {
                if (local_80 != 0) {
                  uVar2 = addUnknownChunks((ucvector *)
                                           CONCAT44(in_stack_fffffffffffff91c,
                                                    in_stack_fffffffffffff918),
                                           (uchar *)CONCAT44(in_stack_fffffffffffff914,
                                                             CONCAT13(in_stack_fffffffffffff913,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff912,
                                                  CONCAT11(in_stack_fffffffffffff911,
                                                           in_stack_fffffffffffff910)))),
                                           (size_t)in_stack_fffffffffffff908);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_e4 != 0) {
                  uVar2 = addChunk_cICP(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_d0 != 0) {
                  uVar2 = addChunk_mDCv(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_a4 != 0) {
                  uVar2 = addChunk_cLLi(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_fc != 0) {
                  uVar2 = addChunk_iCCP((ucvector *)
                                        CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938
                                                ),in_stack_fffffffffffff930,
                                        (LodePNGCompressSettings *)
                                        CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928
                                                ));
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_104 != 0) {
                  uVar2 = addChunk_sRGB((ucvector *)in_stack_fffffffffffff900,
                                        in_stack_fffffffffffff8f8);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_130 != 0) {
                  uVar2 = addChunk_gAMA(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_128 != 0) {
                  uVar2 = addChunk_cHRM(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (*(int *)(local_200 + 0x160) != 0) {
                  uVar2 = addChunk_sBIT((ucvector *)
                                        CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928
                                                ),
                                        (LodePNGInfo *)
                                        CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920
                                                ));
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_170 != 0) {
                  uVar2 = addChunk_eXIf((ucvector *)in_stack_fffffffffffff900,
                                        in_stack_fffffffffffff8f8);
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if (local_1e8._0_4_ == LCT_PALETTE) {
                  uVar2 = addChunk_PLTE((ucvector *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ),
                                        (LodePNGColorMode *)
                                        CONCAT44(in_stack_fffffffffffff914,
                                                 CONCAT13(in_stack_fffffffffffff913,
                                                          CONCAT12(in_stack_fffffffffffff912,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff911,
                                                  in_stack_fffffffffffff910)))));
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                if ((*(int *)(local_28 + 0x98) != 0) &&
                   ((local_1e8._0_4_ == LCT_RGB || (local_1e8._0_4_ == LCT_RGBA)))) {
                  uVar2 = addChunk_PLTE((ucvector *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ),
                                        (LodePNGColorMode *)
                                        CONCAT44(in_stack_fffffffffffff914,
                                                 CONCAT13(in_stack_fffffffffffff913,
                                                          CONCAT12(in_stack_fffffffffffff912,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff911,
                                                  in_stack_fffffffffffff910)))));
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                }
                uVar2 = addChunk_tRNS((ucvector *)
                                      CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                      (LodePNGColorMode *)
                                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920))
                ;
                *(uint *)(local_28 + 0x278) = uVar2;
                if (*(int *)(local_28 + 0x278) == 0) {
                  if (local_1e8._40_4_ != 0) {
                    uVar2 = addChunk_bKGD((ucvector *)
                                          CONCAT44(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918),
                                          (LodePNGInfo *)
                                          CONCAT44(in_stack_fffffffffffff914,
                                                   CONCAT13(in_stack_fffffffffffff913,
                                                            CONCAT12(in_stack_fffffffffffff912,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff911,
                                                  in_stack_fffffffffffff910)))));
                    *(uint *)(local_28 + 0x278) = uVar2;
                    if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                  }
                  if (local_140 != 0) {
                    uVar2 = addChunk_pHYs(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
                    *(uint *)(local_28 + 0x278) = uVar2;
                    if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                  }
                  if (local_78 != 0) {
                    uVar2 = addUnknownChunks((ucvector *)
                                             CONCAT44(in_stack_fffffffffffff91c,
                                                      in_stack_fffffffffffff918),
                                             (uchar *)CONCAT44(in_stack_fffffffffffff914,
                                                               CONCAT13(in_stack_fffffffffffff913,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff912,
                                                  CONCAT11(in_stack_fffffffffffff911,
                                                           in_stack_fffffffffffff910)))),
                                             (size_t)in_stack_fffffffffffff908);
                    *(uint *)(local_28 + 0x278) = uVar2;
                    if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                  }
                  uVar2 = addChunk_IDAT((ucvector *)in_stack_fffffffffffff930,
                                        (uchar *)CONCAT44(in_stack_fffffffffffff92c,
                                                          in_stack_fffffffffffff928),
                                        CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920
                                                ),
                                        (LodePNGCompressSettings *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                  *(uint *)(local_28 + 0x278) = uVar2;
                  if (*(int *)(local_28 + 0x278) == 0) {
                    if (local_15c != 0) {
                      uVar2 = addChunk_tIME(in_stack_fffffffffffff908,
                                            (LodePNGTime *)in_stack_fffffffffffff900);
                      *(uint *)(local_28 + 0x278) = uVar2;
                      if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                    }
                    for (pcVar7 = (char *)0x0; pcVar7 != (char *)local_1e8._56_8_;
                        pcVar7 = pcVar7 + 1) {
                      sVar4 = lodepng_strlen(*(char **)(local_1a8 + (long)pcVar7 * 8));
                      if (0x4f < sVar4) {
                        *(undefined4 *)(local_28 + 0x278) = 0x42;
                        goto LAB_003515fc;
                      }
                      sVar4 = lodepng_strlen(*(char **)(local_1a8 + (long)pcVar7 * 8));
                      if (sVar4 == 0) {
                        *(undefined4 *)(local_28 + 0x278) = 0x43;
                        goto LAB_003515fc;
                      }
                      if (*(int *)(local_28 + 0xa0) == 0) {
                        uVar2 = addChunk_tEXt((ucvector *)
                                              CONCAT44(in_stack_fffffffffffff92c,
                                                       in_stack_fffffffffffff928),
                                              (char *)CONCAT44(in_stack_fffffffffffff924,
                                                               in_stack_fffffffffffff920),
                                              (char *)CONCAT44(in_stack_fffffffffffff91c,
                                                               in_stack_fffffffffffff918));
                        *(uint *)(local_28 + 0x278) = uVar2;
                        iVar3 = *(int *)(local_28 + 0x278);
                      }
                      else {
                        uVar2 = addChunk_zTXt(in_stack_fffffffffffff948,pcVar7,
                                              (char *)CONCAT44(in_stack_fffffffffffff93c,
                                                               in_stack_fffffffffffff938),
                                              (LodePNGCompressSettings *)in_stack_fffffffffffff930);
                        *(uint *)(local_28 + 0x278) = uVar2;
                        iVar3 = *(int *)(local_28 + 0x278);
                      }
                      if (iVar3 != 0) goto LAB_003515fc;
                    }
                    if (*(int *)(local_28 + 0x9c) != 0) {
                      bVar6 = false;
                      for (pcVar7 = (char *)0x0; pcVar7 != (char *)local_1e8._56_8_;
                          pcVar7 = pcVar7 + 1) {
                        pcVar1 = *(char **)(local_1a8 + (long)pcVar7 * 8);
                        if (((((*pcVar1 == 'L') && (pcVar1[1] == 'o')) && (pcVar1[2] == 'd')) &&
                            ((pcVar1[3] == 'e' && (pcVar1[4] == 'P')))) &&
                           ((pcVar1[5] == 'N' && ((pcVar1[6] == 'G' && (pcVar1[7] == '\0')))))) {
                          bVar6 = true;
                          break;
                        }
                      }
                      if (!bVar6) {
                        uVar2 = addChunk_tEXt((ucvector *)
                                              CONCAT44(in_stack_fffffffffffff92c,
                                                       in_stack_fffffffffffff928),
                                              (char *)CONCAT44(in_stack_fffffffffffff924,
                                                               in_stack_fffffffffffff920),
                                              (char *)CONCAT44(in_stack_fffffffffffff91c,
                                                               in_stack_fffffffffffff918));
                        *(uint *)(local_28 + 0x278) = uVar2;
                        if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                      }
                    }
                    for (ppcVar8 = (char **)0x0; ppcVar8 != local_198;
                        ppcVar8 = (char **)((long)ppcVar8 + 1)) {
                      sVar4 = lodepng_strlen(local_190[(long)ppcVar8]);
                      if (0x4f < sVar4) {
                        *(undefined4 *)(local_28 + 0x278) = 0x42;
                        goto LAB_003515fc;
                      }
                      sVar4 = lodepng_strlen(local_190[(long)ppcVar8]);
                      if (sVar4 == 0) {
                        *(undefined4 *)(local_28 + 0x278) = 0x43;
                        goto LAB_003515fc;
                      }
                      uVar2 = addChunk_iTXt(in_stack_fffffffffffff978,in_stack_fffffffffffff974,
                                            (char *)CONCAT44(in_stack_fffffffffffff96c,
                                                             in_stack_fffffffffffff968),
                                            (char *)CONCAT44(in_stack_fffffffffffff964,
                                                             in_stack_fffffffffffff960),
                                            (char *)CONCAT44(in_stack_fffffffffffff95c,
                                                             in_stack_fffffffffffff958),
                                            (char *)in_stack_fffffffffffff950,
                                            in_stack_fffffffffffff990);
                      *(uint *)(local_28 + 0x278) = uVar2;
                      if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                    }
                    if (local_70 != (uchar *)0x0) {
                      uVar2 = addUnknownChunks((ucvector *)
                                               CONCAT44(in_stack_fffffffffffff91c,
                                                        in_stack_fffffffffffff918),
                                               (uchar *)CONCAT44(in_stack_fffffffffffff914,
                                                                 CONCAT13(in_stack_fffffffffffff913,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff912,
                                                  CONCAT11(in_stack_fffffffffffff911,
                                                           in_stack_fffffffffffff910)))),
                                               (size_t)in_stack_fffffffffffff908);
                      *(uint *)(local_28 + 0x278) = uVar2;
                      if (*(int *)(local_28 + 0x278) != 0) goto LAB_003515fc;
                    }
                    uVar2 = addChunk_IEND((ucvector *)0x3515d7);
                    *(uint *)(local_28 + 0x278) = uVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      *(undefined4 *)(local_28 + 0x278) = 0x47;
    }
  }
  else {
    *(undefined4 *)(local_28 + 0x278) = 0x3d;
  }
LAB_003515fc:
  lodepng_info_cleanup((LodePNGInfo *)0x351609);
  lodepng_free((void *)0x351616);
  lodepng_color_mode_cleanup((LodePNGColorMode *)0x351623);
  *local_8 = local_50.data;
  *local_10 = local_50.size;
  return *(uint *)(local_28 + 0x278);
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state) {
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;
  ucvector outv = ucvector_init(NULL, 0);
  LodePNGInfo info;
  const LodePNGInfo* info_png = &state->info_png;
  LodePNGColorMode auto_color;

  lodepng_info_init(&info);
  lodepng_color_mode_init(&auto_color);

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  /*check input values validity*/
  if((info_png->color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info_png->color.palettesize == 0 || info_png->color.palettesize > 256)) {
    /*this error is returned even if auto_convert is enabled and thus encoder could
    generate the palette by itself: while allowing this could be possible in theory,
    it may complicate the code or edge cases, and always requiring to give a palette
    when setting this color type is a simpler contract*/
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    goto cleanup;
  }
  if(state->encoder.zlibsettings.btype > 2) {
    state->error = 61; /*error: invalid btype*/
    goto cleanup;
  }
  if(info_png->interlace_method > 1) {
    state->error = 71; /*error: invalid interlace mode*/
    goto cleanup;
  }
  state->error = checkColorValidity(info_png->color.colortype, info_png->color.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/

  /* color convert and compute scanline filter types */
  lodepng_info_copy(&info, &state->info_png);
  if(state->encoder.auto_convert) {
    LodePNGColorStats stats;
    unsigned allow_convert = 1;
    lodepng_color_stats_init(&stats);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->iccp_defined &&
        isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use palette with a GRAY ICC profile, even
      if the palette has only gray colors, so disallow it.*/
      stats.allow_palette = 0;
    }
    if(info_png->iccp_defined &&
        isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use grayscale color with RGB ICC profile, so disallow gray.*/
      stats.allow_greyscale = 0;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = lodepng_compute_color_stats(&stats, image, w, h, &state->info_raw);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->background_defined) {
      /*the background chunk's color must be taken into account as well*/
      unsigned r = 0, g = 0, b = 0;
      LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGB, 16);
      lodepng_convert_rgb(&r, &g, &b,
          info_png->background_r, info_png->background_g, info_png->background_b, &mode16, &info_png->color);
      state->error = lodepng_color_stats_add(&stats, r, g, b, 65535);
      if(state->error) goto cleanup;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = auto_choose_color(&auto_color, &state->info_raw, &stats);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->sbit_defined) {
      /*if sbit is defined, due to strict requirements of which sbit values can be present for which color modes,
      auto_convert can't be done in many cases. However, do support a few cases here.
      TODO: more conversions may be possible, and it may also be possible to get a more appropriate color type out of
            auto_choose_color if knowledge about sbit is used beforehand
      */
      unsigned sbit_max = LODEPNG_MAX(LODEPNG_MAX(LODEPNG_MAX(info_png->sbit_r, info_png->sbit_g),
                           info_png->sbit_b), info_png->sbit_a);
      unsigned equal = (!info_png->sbit_g || info_png->sbit_g == info_png->sbit_r)
                    && (!info_png->sbit_b || info_png->sbit_b == info_png->sbit_r)
                    && (!info_png->sbit_a || info_png->sbit_a == info_png->sbit_r);
      allow_convert = 0;
      if(info.color.colortype == LCT_PALETTE &&
         auto_color.colortype == LCT_PALETTE) {
        /* input and output are palette, and in this case it may happen that palette data is
        expected to be copied from info_raw into the info_png */
        allow_convert = 1;
      }
      /*going from 8-bit RGB to palette (or 16-bit as long as sbit_max <= 8) is possible
      since both are 8-bit RGB for sBIT's purposes*/
      if(info.color.colortype == LCT_RGB &&
         auto_color.colortype == LCT_PALETTE && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 8-bit RGBA to palette is also ok but only if sbit_a is exactly 8*/
      if(info.color.colortype == LCT_RGBA && auto_color.colortype == LCT_PALETTE &&
         info_png->sbit_a == 8 && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 16-bit RGB(A) to 8-bit RGB(A) is ok if all sbit values are <= 8*/
      if((info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA) && info.color.bitdepth == 16 &&
         auto_color.colortype == info.color.colortype && auto_color.bitdepth == 8 &&
         sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going to less channels is ok if all bit values are equal (all possible values in sbit,
        as well as the chosen bitdepth of the result). Due to how auto_convert works,
        we already know that auto_color.colortype has less than or equal amount of channels than
        info.colortype. Palette is not used here. This conversion is not allowed if
        info_png->sbit_r < auto_color.bitdepth, because specifically for alpha, non-presence of
        an sbit value heavily implies that alpha's bit depth is equal to the PNG bit depth (rather
        than the bit depths set in the r, g and b sbit values, by how the PNG specification describes
        handling tRNS chunk case with sBIT), so be conservative here about ignoring user input.*/
      if(info.color.colortype != LCT_PALETTE && auto_color.colortype != LCT_PALETTE &&
         equal && info_png->sbit_r == auto_color.bitdepth) {
        allow_convert = 1;
      }
    }
#endif
    if(state->encoder.force_palette) {
      if(info.color.colortype != LCT_GREY && info.color.colortype != LCT_GREY_ALPHA &&
         (auto_color.colortype == LCT_GREY || auto_color.colortype == LCT_GREY_ALPHA)) {
        /*user speficially forced a PLTE palette, so cannot convert to grayscale types because
        the PNG specification only allows writing a suggested palette in PLTE for truecolor types*/
        allow_convert = 0;
      }
    }
    if(allow_convert) {
      lodepng_color_mode_copy(&info.color, &auto_color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*also convert the background chunk*/
      if(info_png->background_defined) {
        if(lodepng_convert_rgb(&info.background_r, &info.background_g, &info.background_b,
            info_png->background_r, info_png->background_g, info_png->background_b, &info.color, &info_png->color)) {
          state->error = 104;
          goto cleanup;
        }
      }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    }
  }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  if(info_png->iccp_defined) {
    unsigned gray_icc = isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned rgb_icc = isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned gray_png = info.color.colortype == LCT_GREY || info.color.colortype == LCT_GREY_ALPHA;
    if(!gray_icc && !rgb_icc) {
      state->error = 100; /* Disallowed profile color type for PNG */
      goto cleanup;
    }
    if(gray_icc != gray_png) {
      /*Not allowed to use RGB/RGBA/palette with GRAY ICC profile or vice versa,
      or in case of auto_convert, it wasn't possible to find appropriate model*/
      state->error = state->encoder.auto_convert ? 102 : 101;
      goto cleanup;
    }
  }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  if(!lodepng_color_mode_equal(&state->info_raw, &info.color)) {
    unsigned char* converted;
    size_t size = ((size_t)w * (size_t)h * (size_t)lodepng_get_bpp(&info.color) + 7u) / 8u;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error) {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) {
      state->error = preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    }
    lodepng_free(converted);
    if(state->error) goto cleanup;
  } else {
    state->error = preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);
    if(state->error) goto cleanup;
  }

  /* output all PNG chunks */ {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    state->error = writeSignature(&outv);
    if(state->error) goto cleanup;
    /*IHDR*/
    state->error = addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) goto cleanup;
    }
    /*color profile chunks must come before PLTE */
    if(info.cicp_defined) {
      state->error = addChunk_cICP(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.mdcv_defined) {
      state->error = addChunk_mDCv(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.clli_defined) {
      state->error = addChunk_cLLi(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.iccp_defined) {
      state->error = addChunk_iCCP(&outv, &info, &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }
    if(info.srgb_defined) {
      state->error = addChunk_sRGB(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.gama_defined) {
      state->error = addChunk_gAMA(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.chrm_defined) {
      state->error = addChunk_cHRM(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info_png->sbit_defined) {
      state->error = addChunk_sBIT(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.exif_defined) {
      state->error = addChunk_eXIf(&outv, &info);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE) {
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA)) {
      /*force_palette means: write suggested palette for truecolor in PLTE chunk*/
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    /*tRNS (this will only add if when necessary) */
    state->error = addChunk_tRNS(&outv, &info.color);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) {
      state->error = addChunk_bKGD(&outv, &info);
      if(state->error) goto cleanup;
    }
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) {
      state->error = addChunk_pHYs(&outv, &info);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) {
      state->error = addChunk_tIME(&outv, &info.time);
      if(state->error) goto cleanup;
    }
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i) {
      if(lodepng_strlen(info.text_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.text_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      if(state->encoder.text_compression) {
        state->error = addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
        if(state->error) goto cleanup;
      } else {
        state->error = addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
        if(state->error) goto cleanup;
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id) {
      unsigned already_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i) {
        const char* k = info.text_keys[i];
        /* Could use strcmp, but we're not calling or reimplementing this C library function for this use only */
        if(k[0] == 'L' && k[1] == 'o' && k[2] == 'd' && k[3] == 'e' &&
           k[4] == 'P' && k[5] == 'N' && k[6] == 'G' && k[7] == '\0') {
          already_added_id_text = 1;
          break;
        }
      }
      if(already_added_id_text == 0) {
        state->error = addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
        if(state->error) goto cleanup;
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i) {
      if(lodepng_strlen(info.itext_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.itext_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      state->error = addChunk_iTXt(
          &outv, state->encoder.text_compression,
          info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
          &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    state->error = addChunk_IEND(&outv);
    if(state->error) goto cleanup;
  }

cleanup:
  lodepng_info_cleanup(&info);
  lodepng_free(data);
  lodepng_color_mode_cleanup(&auto_color);

  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}